

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

char * TextToUtf8(int *codepoints,int length)

{
  char *pcVar1;
  void *ptr;
  int local_30;
  int bytes;
  int i;
  int size;
  char *utf8;
  char *text;
  int *piStack_10;
  int length_local;
  int *codepoints_local;
  
  text._4_4_ = length;
  piStack_10 = codepoints;
  utf8 = (char *)calloc((long)(length * 5),1);
  _i = (char *)0x0;
  bytes = 0;
  ptr._4_4_ = 0;
  for (local_30 = 0; local_30 < text._4_4_; local_30 = local_30 + 1) {
    _i = CodepointToUtf8(piStack_10[local_30],(int *)((long)&ptr + 4));
    memcpy(utf8 + bytes,_i,(long)ptr._4_4_);
    bytes = ptr._4_4_ + bytes;
  }
  pcVar1 = (char *)realloc(utf8,(long)(bytes + 1));
  if (pcVar1 != (char *)0x0) {
    utf8 = pcVar1;
  }
  return utf8;
}

Assistant:

char *TextToUtf8(int *codepoints, int length)
{
    // We allocate enough memory fo fit all possible codepoints
    // NOTE: 5 bytes for every codepoint should be enough
    char *text = (char *)RL_CALLOC(length*5, 1);
    const char *utf8 = NULL;
    int size = 0;

    for (int i = 0, bytes = 0; i < length; i++)
    {
        utf8 = CodepointToUtf8(codepoints[i], &bytes);
        memcpy(text + size, utf8, bytes);
        size += bytes;
    }

    // Resize memory to text length + string NULL terminator
    void *ptr = RL_REALLOC(text, size + 1);

    if (ptr != NULL) text = (char *)ptr;

    return text;
}